

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager.cc
# Opt level: O0

Operation * __thiscall
MemoryManager::build_operation(MemoryManager *this,OpCode code,long left,long right)

{
  Operation *pOVar1;
  value_type local_30;
  Operation *op;
  long right_local;
  long left_local;
  MemoryManager *pMStack_10;
  OpCode code_local;
  MemoryManager *this_local;
  
  local_30 = (value_type)0x0;
  op = (Operation *)right;
  right_local = left;
  left_local._4_4_ = code;
  pMStack_10 = this;
  switch(code) {
  case Op_Sum:
    pOVar1 = (Operation *)operator_new(0x18);
    Sum::Sum((Sum *)pOVar1,right_local,(long)op);
    local_30 = pOVar1;
    break;
  case Op_Mul:
    pOVar1 = (Operation *)operator_new(0x18);
    Mul::Mul((Mul *)pOVar1,right_local,(long)op);
    local_30 = pOVar1;
    break;
  case Op_Sub:
    pOVar1 = (Operation *)operator_new(0x18);
    Sub::Sub((Sub *)pOVar1,right_local,(long)op);
    local_30 = pOVar1;
    break;
  case Op_Div:
    pOVar1 = (Operation *)operator_new(0x18);
    Div::Div((Div *)pOVar1,right_local,(long)op);
    local_30 = pOVar1;
    break;
  default:
    __assert_fail("0 == \"Error: unexpected operation code.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/rg3[P]cifras/memory_manager.cc"
                  ,0x36,"Operation *MemoryManager::build_operation(OpCode, long, long)");
  }
  std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::push_back
            (&this->operations,&local_30);
  return local_30;
}

Assistant:

Operation *MemoryManager::build_operation(OpCode code, long left, long right)
{
	Operation *op = 0;
	switch (code) {
	case Op_Sum:
		op = new Sum(left, right);
		break;
	case Op_Mul:
		op = new Mul(left, right);
		break;
	case Op_Sub:
		op = new Sub(left, right);
		break;
	case Op_Div:
		op = new Div(left, right);
		break;
	default:
		assert(0 == "Error: unexpected operation code.");
		break;
	}
	operations.push_back(op);
	return op;
}